

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

void __thiscall
apngasm::APNGAsm::get_rect
          (APNGAsm *this,uint w,uint h,uchar *pimage1,uchar *pimage2,uchar *ptemp,uchar coltype,
          uint bpp,uint stride,int zbuf_size,uint has_tcolor,uint tcolor,int n)

{
  ushort uVar1;
  bool bVar2;
  uint local_e8;
  uint c2_2;
  uint c1_2;
  uint *pc_3;
  uint *pb_3;
  uint *pa_3;
  uint c2_1;
  uint c1_1;
  uchar *pc_2;
  uchar *pb_2;
  uchar *pa_2;
  uint c2;
  uint c1;
  unsigned_short *pc_1;
  unsigned_short *pb_1;
  unsigned_short *pa_1;
  byte *pbStack_80;
  uchar c;
  uchar *pc;
  uchar *pb;
  uchar *pa;
  uint over_is_possible;
  uint diffnum;
  uint y_max;
  uint x_max;
  uint y_min;
  uint x_min;
  uint h0;
  uint w0;
  uint y0;
  uint x0;
  uint j;
  uint i;
  uchar *ptemp_local;
  uchar *pimage2_local;
  uchar *pimage1_local;
  uint h_local;
  uint w_local;
  APNGAsm *this_local;
  
  x_max = w - 1;
  y_max = h - 1;
  diffnum = 0;
  over_is_possible = 0;
  pa._4_4_ = 0;
  bVar2 = has_tcolor != 0;
  if (bpp == 1) {
    pbStack_80 = ptemp;
    pc = pimage2;
    pb = pimage1;
    for (y0 = 0; y0 < h; y0 = y0 + 1) {
      for (x0 = 0; x0 < w; x0 = x0 + 1) {
        pa_1._7_1_ = *pc;
        if (*pb == pa_1._7_1_) {
          pa_1._7_1_ = (byte)tcolor;
        }
        else {
          pa._4_4_ = pa._4_4_ + 1;
          if (((coltype == '\0') && (has_tcolor != 0)) && (pa_1._7_1_ == tcolor)) {
            bVar2 = false;
          }
          if ((coltype == '\x03') && (this->_trns[pa_1._7_1_] != 0xff)) {
            bVar2 = false;
          }
          if (x0 < x_max) {
            x_max = x0;
          }
          if (diffnum < x0) {
            diffnum = x0;
          }
          if (y0 < y_max) {
            y_max = y0;
          }
          if (over_is_possible < y0) {
            over_is_possible = y0;
          }
        }
        *pbStack_80 = pa_1._7_1_;
        pbStack_80 = pbStack_80 + 1;
        pc = pc + 1;
        pb = pb + 1;
      }
    }
  }
  else if (bpp == 2) {
    _c2 = (ushort *)ptemp;
    pc_1 = (unsigned_short *)pimage2;
    pb_1 = (unsigned_short *)pimage1;
    for (y0 = 0; y0 < h; y0 = y0 + 1) {
      for (x0 = 0; x0 < w; x0 = x0 + 1) {
        uVar1 = *pc_1;
        if ((*pb_1 == uVar1) || ((*pb_1 >> 8 == 0 && (uVar1 >> 8 == 0)))) {
          uVar1 = 0;
        }
        else {
          pa._4_4_ = pa._4_4_ + 1;
          if (uVar1 >> 8 != 0xff) {
            bVar2 = false;
          }
          if (x0 < x_max) {
            x_max = x0;
          }
          if (diffnum < x0) {
            diffnum = x0;
          }
          if (y0 < y_max) {
            y_max = y0;
          }
          if (over_is_possible < y0) {
            over_is_possible = y0;
          }
        }
        *_c2 = uVar1;
        _c2 = _c2 + 1;
        pc_1 = pc_1 + 1;
        pb_1 = pb_1 + 1;
      }
    }
  }
  else if (bpp == 3) {
    _c2_1 = ptemp;
    pc_2 = pimage2;
    pb_2 = pimage1;
    for (y0 = 0; y0 < h; y0 = y0 + 1) {
      for (x0 = 0; x0 < w; x0 = x0 + 1) {
        pa_3._0_4_ = (uint)pc_2[2] * 0x10000 + (uint)pc_2[1] * 0x100 + (uint)*pc_2;
        if ((uint)pb_2[2] * 0x10000 + (uint)pb_2[1] * 0x100 + (uint)*pb_2 == (uint)pa_3) {
          pa_3._0_4_ = tcolor;
        }
        else {
          pa._4_4_ = pa._4_4_ + 1;
          if ((has_tcolor != 0) && ((uint)pa_3 == tcolor)) {
            bVar2 = false;
          }
          if (x0 < x_max) {
            x_max = x0;
          }
          if (diffnum < x0) {
            diffnum = x0;
          }
          if (y0 < y_max) {
            y_max = y0;
          }
          if (over_is_possible < y0) {
            over_is_possible = y0;
          }
        }
        *(undefined2 *)_c2_1 = pa_3._0_2_;
        _c2_1[2] = pa_3._2_1_;
        pb_2 = pb_2 + 3;
        pc_2 = pc_2 + 3;
        _c2_1 = _c2_1 + 3;
      }
    }
  }
  else if (bpp == 4) {
    _c2_2 = (uint *)ptemp;
    pc_3 = (uint *)pimage2;
    pb_3 = (uint *)pimage1;
    for (y0 = 0; y0 < h; y0 = y0 + 1) {
      for (x0 = 0; x0 < w; x0 = x0 + 1) {
        local_e8 = *pc_3;
        if ((*pb_3 == local_e8) || ((*pb_3 >> 0x18 == 0 && (local_e8 >> 0x18 == 0)))) {
          local_e8 = 0;
        }
        else {
          pa._4_4_ = pa._4_4_ + 1;
          if (local_e8 >> 0x18 != 0xff) {
            bVar2 = false;
          }
          if (x0 < x_max) {
            x_max = x0;
          }
          if (diffnum < x0) {
            diffnum = x0;
          }
          if (y0 < y_max) {
            y_max = y0;
          }
          if (over_is_possible < y0) {
            over_is_possible = y0;
          }
        }
        *_c2_2 = local_e8;
        _c2_2 = _c2_2 + 1;
        pc_3 = pc_3 + 1;
        pb_3 = pb_3 + 1;
      }
    }
  }
  if (pa._4_4_ == 0) {
    h0 = 0;
    w0 = 0;
    y_min = 1;
    x_min = 1;
  }
  else {
    w0 = x_max;
    h0 = y_max;
    x_min = (diffnum - x_max) + 1;
    y_min = (over_is_possible - y_max) + 1;
  }
  deflate_rect_op(this,pimage2,w0,h0,x_min,y_min,bpp,stride,zbuf_size,n << 1);
  if (bVar2) {
    deflate_rect_op(this,ptemp,w0,h0,x_min,y_min,bpp,stride,zbuf_size,n * 2 + 1);
  }
  return;
}

Assistant:

void APNGAsm::get_rect(unsigned int w, unsigned int h, unsigned char *pimage1, unsigned char *pimage2, unsigned char *ptemp, unsigned char coltype, unsigned int bpp, unsigned int stride, int zbuf_size, unsigned int has_tcolor, unsigned int tcolor, int n)
  {
    unsigned int   i, j, x0, y0, w0, h0;
    unsigned int   x_min = w-1;
    unsigned int   y_min = h-1;
    unsigned int   x_max = 0;
    unsigned int   y_max = 0;
    unsigned int   diffnum = 0;
    unsigned int   over_is_possible = 1;

    if (!has_tcolor)
      over_is_possible = 0;

    if (bpp == 1)
    {
      unsigned char *pa = pimage1;
      unsigned char *pb = pimage2;
      unsigned char *pc = ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned char c = *pb++;
        if (*pa++ != c)
        {
          diffnum++;
          if (coltype == 0 && has_tcolor && c == tcolor) over_is_possible = 0;
          if (coltype == 3 && _trns[c] != 0xFF) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c = tcolor;

        *pc++ = c;
      }
    }
    else
    if (bpp == 2)
    {
      unsigned short *pa = (unsigned short *)pimage1;
      unsigned short *pb = (unsigned short *)pimage2;
      unsigned short *pc = (unsigned short *)ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned int c1 = *pa++;
        unsigned int c2 = *pb++;
        if ((c1 != c2) && ((c1>>8) || (c2>>8)))
        {
          diffnum++;
          if ((c2 >> 8) != 0xFF) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c2 = 0;

        *pc++ = c2;
      }
    }
    else
    if (bpp == 3)
    {
      unsigned char *pa = pimage1;
      unsigned char *pb = pimage2;
      unsigned char *pc = ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned int c1 = (pa[2]<<16) + (pa[1]<<8) + pa[0];
        unsigned int c2 = (pb[2]<<16) + (pb[1]<<8) + pb[0];
        if (c1 != c2)
        {
          diffnum++;
          if (has_tcolor && c2 == tcolor) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c2 = tcolor;

        memcpy(pc, &c2, 3);
        pa += 3;
        pb += 3;
        pc += 3;
      }
    }
    else
    if (bpp == 4)
    {
      unsigned int *pa = (unsigned int *)pimage1;
      unsigned int *pb = (unsigned int *)pimage2;
      unsigned int *pc = (unsigned int *)ptemp;

      for (j=0; j<h; j++)
      for (i=0; i<w; i++)
      {
        unsigned int c1 = *pa++;
        unsigned int c2 = *pb++;
        if ((c1 != c2) && ((c1>>24) || (c2>>24)))
        {
          diffnum++;
          if ((c2 >> 24) != 0xFF) over_is_possible = 0;
          if (i<x_min) x_min = i;
          if (i>x_max) x_max = i;
          if (j<y_min) y_min = j;
          if (j>y_max) y_max = j;
        }
        else
          c2 = 0;

        *pc++ = c2;
      }
    }

    if (diffnum == 0)
    {
      x0 = y0 = 0;
      w0 = h0 = 1;
    }
    else
    {
      x0 = x_min;
      y0 = y_min;
      w0 = x_max-x_min+1;
      h0 = y_max-y_min+1;
    }

    deflate_rect_op(pimage2, x0, y0, w0, h0, bpp, stride, zbuf_size, n*2);

    if (over_is_possible)
      deflate_rect_op(ptemp, x0, y0, w0, h0, bpp, stride, zbuf_size, n*2+1);
  }